

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

int SimpleLoggerMgr::getTzGap(void)

{
  tm *src;
  tm *src_00;
  TimeInfo gmt;
  TimeInfo lt;
  tm *gmt_tm;
  tm *lt_tm;
  tm new_time;
  time_t raw_time;
  time_point now;
  TimeInfo TStackY_98;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_68;
  tm local_48;
  time_t local_10;
  undefined8 local_8;
  
  local_8 = std::chrono::_V2::system_clock::now();
  local_10 = std::chrono::_V2::system_clock::to_time_t
                       ((time_point *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
  ;
  src = localtime_r(&local_10,&local_48);
  src_00 = gmtime(&local_10);
  TimeInfo::TimeInfo((TimeInfo *)&stack0xffffffffffffff88,(tm *)src);
  TimeInfo::TimeInfo(&TStackY_98,(tm *)src_00);
  return (in_stack_ffffffffffffff90 * 0x5a0 + in_stack_ffffffffffffff94 * 0x3c + local_68) -
         (TStackY_98.day * 0x5a0 + TStackY_98.hour * 0x3c + TStackY_98.min);
}

Assistant:

int SimpleLoggerMgr::getTzGap() {
    std::chrono::system_clock::time_point now =
        std::chrono::system_clock::now();
    std::time_t raw_time = std::chrono::system_clock::to_time_t(now);
    std::tm new_time;

#if defined(__linux__) || defined(__APPLE__)
    std::tm* lt_tm = localtime_r(&raw_time, &new_time);
    std::tm* gmt_tm = std::gmtime(&raw_time);

#elif defined(WIN32) || defined(_WIN32)
    localtime_s(&new_time, &raw_time);
    std::tm* lt_tm = &new_time;
    std::tm new_gmt_time;
    gmtime_s(&new_gmt_time, &raw_time);
    std::tm* gmt_tm = &new_gmt_time;
#endif

    TimeInfo lt(lt_tm);
    TimeInfo gmt(gmt_tm);

    return ( (  lt.day * 60 * 24 +  lt.hour * 60 +  lt.min ) -
             ( gmt.day * 60 * 24 + gmt.hour * 60 + gmt.min ) );
}